

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void ClearInventory(AActor *activator)

{
  player_t *ppVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  undefined4 extraout_var_00;
  undefined8 *puVar5;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *paVar6;
  int i;
  long lVar7;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar8;
  bool bVar9;
  
  if (activator == (AActor *)0x0) {
    puVar5 = &players;
    lVar7 = 0;
    do {
      if (playeringame[lVar7] == true) {
        AActor::ClearInventory((AActor *)*puVar5);
      }
      lVar7 = lVar7 + 1;
      puVar5 = puVar5 + 0x54;
    } while (lVar7 != 8);
    return;
  }
  aVar8 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)(activator->Inventory).field_0.p;
  if (aVar8 != (AInventory *)0x0) {
    paVar6 = &(activator->Inventory).field_0;
    do {
      pPVar2 = AAmmo::RegistrationInfo.MyClass;
      if (((aVar8.p)->ItemFlags & 0x20) == 0) {
        if (((aVar8.p)->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**((aVar8.p)->super_AActor).super_DThinker.super_DObject._vptr_DObject)(aVar8.p);
          ((aVar8.p)->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (aVar8.o)->Class;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (bVar9) {
          (aVar8.p)->Amount = 0;
LAB_0051f16d:
          paVar6 = &((aVar8.p)->super_AActor).Inventory.field_0;
        }
        else {
          (*((aVar8.p)->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(aVar8.p);
        }
      }
      else {
        if (((aVar8.p)->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**((aVar8.p)->super_AActor).super_DThinker.super_DObject._vptr_DObject)(aVar8.p);
          ((aVar8.p)->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_00,iVar3);
        }
        if (((aVar8.p)->super_AActor).super_DThinker.super_DObject.Class !=
            AHexenArmor::RegistrationInfo.MyClass) goto LAB_0051f16d;
        paVar6 = &((aVar8.p)->super_AActor).Inventory.field_0;
        aVar8.p[1].super_AActor.super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
        aVar8.p[1].super_AActor.super_DThinker.super_DObject.GCNext = (DObject *)0x0;
        aVar8.p[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
        aVar8.p[1].super_AActor.super_DThinker.super_DObject.Class = (PClass *)0x0;
      }
      aVar8 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)paVar6->p;
    } while (aVar8.p != (AInventory *)0x0);
  }
  ppVar1 = activator->player;
  if (ppVar1 != (player_t *)0x0) {
    ppVar1->ReadyWeapon = (AWeapon *)0x0;
    ppVar1->PendingWeapon = (AWeapon *)0xffffffffffffffff;
  }
  return;
}

Assistant:

static void ClearInventory (AActor *activator)
{
	if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->ClearInventory();
		}
	}
	else
	{
		activator->ClearInventory();
	}
}